

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

uint32_t mipsdsp_sat32_sub(int32_t a,int32_t b,CPUMIPSState_conflict5 *env)

{
  undefined4 local_1c;
  int32_t temp;
  CPUMIPSState_conflict5 *env_local;
  int32_t b_local;
  int32_t a_local;
  
  local_1c = a - b;
  if (((a ^ b) & (a ^ local_1c) & 0x80000000) != 0) {
    if (a < 0) {
      local_1c = 0x80000000;
    }
    else {
      local_1c = 0x7fffffff;
    }
    set_DSPControl_overflow_flag(1,0x14,env);
  }
  return local_1c;
}

Assistant:

static inline uint32_t mipsdsp_sat32_sub(int32_t a, int32_t b,
                                         CPUMIPSState *env)
{
    int32_t  temp;

    temp = a - b;
    if (MIPSDSP_OVERFLOW_SUB(a, b, temp, 0x80000000)) {
        if (a >= 0) {
            temp = 0x7FFFFFFF;
        } else {
            temp = 0x80000000;
        }
        set_DSPControl_overflow_flag(1, 20, env);
    }

    return temp & 0xFFFFFFFFull;
}